

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
* __thiscall
flatbuffers::BinaryAnnotator::Annotate
          (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
           *__return_storage_ptr__,BinaryAnnotator *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint64_t table_offset;
  Object *table;
  Verifier verifier;
  
  if ((((this->bfbs_ == (uint8_t *)0x0) || (this->bfbs_length_ == 0)) ||
      (((VerifierTemplate<false>::VerifierTemplate
                   (&verifier,this->bfbs_,this->bfbs_length_,0x40,1000000,true),
        this->is_size_prefixed_ != true ||
        (bVar2 = reflection::VerifySizePrefixedSchemaBuffer(&verifier), bVar2)) &&
       (bVar2 = reflection::VerifySchemaBuffer(&verifier), bVar2)))) && (0xb < this->binary_length_)
     ) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
    ::clear(&(this->vtables_)._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
    ::clear(&(this->sections_)._M_t);
    table_offset = BuildHeader(this,0);
    if (table_offset < this->binary_length_) {
      table = RootTable(this);
      BuildTable(this,table_offset,RootTable,table);
    }
    FixMissingRegions(this);
    FixMissingSections(this);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
    ::_Rb_tree(&__return_storage_ptr__->_M_t,&(this->sections_)._M_t);
    return __return_storage_ptr__;
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return __return_storage_ptr__;
}

Assistant:

std::map<uint64_t, BinarySection> BinaryAnnotator::Annotate() {
  if (bfbs_ != nullptr && bfbs_length_ != 0) {
    flatbuffers::Verifier verifier(bfbs_, static_cast<size_t>(bfbs_length_));
    if ((is_size_prefixed_ &&
         !reflection::VerifySizePrefixedSchemaBuffer(verifier)) ||
        !reflection::VerifySchemaBuffer(verifier)) {
      return {};
    }
  }

  // The binary is too short to read as a flatbuffers.
  if (binary_length_ < FLATBUFFERS_MIN_BUFFER_SIZE) { return {}; }

  // Make sure we start with a clean slate.
  vtables_.clear();
  sections_.clear();

  // First parse the header region which always start at offset 0.
  // The returned offset will point to the root_table location.
  const uint64_t root_table_offset = BuildHeader(0);

  if (IsValidOffset(root_table_offset)) {
    // Build the root table, and all else will be referenced from it.
    BuildTable(root_table_offset, BinarySectionType::RootTable, RootTable());
  }

  // Now that all the sections are built, make sure the binary sections are
  // contiguous.
  FixMissingRegions();

  // Then scan the area between BinarySections insert padding sections that are
  // implied.
  FixMissingSections();

  return sections_;
}